

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  _Rb_tree_node_base *output;
  _Rb_tree_node_base *info;
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  cmLocalUnixMakefileGenerator3 *pcVar5;
  bool bVar6;
  Encoding encoding;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  LocalObjectInfo *__range2;
  LocalObjectEntry *entry;
  _Base_ptr p_Var9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ruleFileName;
  string ruleFileNameFull;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  cmGeneratedFileStream ruleFileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  cmLocalUnixMakefileGenerator3 *local_340;
  string local_338;
  string local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_298 [616];
  
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Makefile","");
  ConvertToFullPath(&local_318,this,&local_338);
  encoding = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_318,false,encoding);
  if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) == 0) {
    bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar6) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
    }
    WriteLocalAllRules(this,(ostream *)local_298);
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2c8._M_impl.super__Rb_tree_header._M_header;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (bVar6) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_298,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2c8);
    }
    else {
      WriteLocalMakefileTargets
                (this,(ostream *)local_298,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2c8);
    }
    bVar6 = this->SkipPreprocessedSourceRules;
    bVar3 = this->SkipAssemblySourceRules;
    p_Var2 = &local_2f8._M_impl.super__Rb_tree_header;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                              *)&local_2f8);
    p_Var8 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
    pcVar5 = this;
    if ((_Rb_tree_header *)local_2f8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      do {
        local_340 = pcVar5;
        output = p_Var8 + 1;
        info = p_Var8 + 2;
        WriteObjectConvenienceRule
                  (local_340,(ostream *)local_298,"target to build an object file",(string *)output,
                   (LocalObjectInfo *)info);
        p_Var4 = p_Var8[2]._M_parent;
        for (p_Var9 = *(_Base_ptr *)(p_Var8 + 2); p_Var9 != p_Var4;
            p_Var9 = (_Base_ptr)&p_Var9[1]._M_parent) {
          pp_Var1 = &p_Var9->_M_parent;
          iVar7 = std::__cxx11::string::compare((char *)pp_Var1);
          if ((((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pp_Var1), iVar7 == 0)
               ) || (iVar7 = std::__cxx11::string::compare((char *)pp_Var1), iVar7 == 0)) ||
             (((iVar7 = std::__cxx11::string::compare((char *)pp_Var1), iVar7 == 0 ||
               (iVar7 = std::__cxx11::string::compare((char *)pp_Var1), iVar7 == 0)) ||
              (iVar7 = std::__cxx11::string::compare((char *)pp_Var1), iVar7 == 0)))) {
            if (bVar6 == false) {
              std::__cxx11::string::rfind((char *)output,0x6ac20d,0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)&local_380,(ulong)output);
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_360,local_380._M_dataplus._M_p,
                         local_380._M_dataplus._M_p + local_380._M_string_length);
              pcVar5 = local_340;
              std::__cxx11::string::append((char *)&local_360);
              WriteObjectConvenienceRule
                        (pcVar5,(ostream *)local_298,"target to preprocess a source file",&local_360
                         ,(LocalObjectInfo *)info);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              *(undefined1 *)((long)&p_Var8[2]._M_right + 1) = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar3 == false) {
              std::__cxx11::string::rfind((char *)output,0x6ac20d,0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)&local_380,(ulong)output);
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_360,local_380._M_dataplus._M_p,
                         local_380._M_dataplus._M_p + local_380._M_string_length);
              pcVar5 = local_340;
              std::__cxx11::string::append((char *)&local_360);
              WriteObjectConvenienceRule
                        (pcVar5,(ostream *)local_298,"target to generate assembly for a file",
                         &local_360,(LocalObjectInfo *)info);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              *(undefined1 *)((long)&p_Var8[2]._M_right + 2) = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
            }
            break;
          }
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        this = local_340;
        pcVar5 = local_340;
      } while ((_Rb_tree_header *)p_Var8 != &local_2f8._M_impl.super__Rb_tree_header);
    }
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"help","");
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&local_2c8,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_298,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)local_298);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~_Rb_tree(&local_2f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2c8);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!ruleFileStream) {
    return;
  }
  // always write the top makefile
  if (!this->IsRootMakefile()) {
    ruleFileStream.SetCopyIfDifferent(true);
  }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (!this->IsRootMakefile()) {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream, emittedTargets);
  } else {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream, emittedTargets);
  }

  bool do_preprocess_rules = this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules = this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (auto& localObjectFile : localObjectFiles) {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(
      ruleFileStream, "target to build an object file", localObjectFile.first,
      localObjectFile.second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for (LocalObjectEntry const& entry : localObjectFile.second) {
      if (entry.Language == "C" || entry.Language == "CXX" ||
          entry.Language == "CUDA" || entry.Language == "Fortran" ||
          entry.Language == "HIP" || entry.Language == "ISPC") {
        // Right now, C, C++, CUDA, Fortran, HIP and ISPC have both a
        // preprocessor and the ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
      }
    }

    // Add convenience rules for preprocessed and assembly files.
    if (lang_has_preprocessor && do_preprocess_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(ruleFileStream,
                                       "target to preprocess a source file",
                                       (base + ".i"), localObjectFile.second);
      localObjectFile.second.HasPreprocessRule = true;
    }

    if (lang_has_assembly && do_assembly_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to generate assembly for a file",
        (base + ".s"), localObjectFile.second);
      localObjectFile.second.HasAssembleRule = true;
    }
  }

  // add a help target as long as there isn;t a real target named help
  if (emittedTargets.insert("help").second) {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream, this);
  }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}